

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,LabelDecl *label)

{
  pointer pLVar1;
  
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->label_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
      ._M_impl.super__Vector_impl_data._M_start == pLVar1) {
    __assert_fail("!label_stack_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                  ,0x279,"bool wabt::(anonymous namespace)::CWriter::IsTopLabelUsed() const");
  }
  if (pLVar1[-1].used == true) {
    WriteData(this,(label->name)._M_dataplus._M_p,(label->name)._M_string_length);
    WriteData(this,":;",2);
    Write(this);
    return;
  }
  return;
}

Assistant:

std::string CWriter::DefineInstanceMemberName(ModuleFieldType type,
                                              std::string_view name) {
  return ClaimUniqueName(
      global_syms_, global_sym_map_, MangleField(type), name,
      kGlobalSymbolPrefix + MangleName(StripLeadingDollar(name)));
}